

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bidi_test.c
# Opt level: O2

int main(int argc,char **argv)

{
  char *__s1;
  int iVar1;
  int iVar2;
  FILE *__stream;
  bool bVar3;
  char *__format;
  code *pcVar4;
  bool bVar5;
  
  ctx = bidi_new_context();
  pcVar4 = (code *)0x0;
  bVar5 = false;
  do {
    bVar3 = true;
    do {
      while( true ) {
        iVar2 = argc;
        argv = argv + 1;
        if (iVar2 < 2) {
          if (bVar5) {
            printf("pass %d fail %d total %d\n",(ulong)(uint)pass,(ulong)(uint)fail,
                   (ulong)(uint)(fail + pass));
            bidi_free_context(ctx);
            return (uint)(fail != 0);
          }
          usage((FILE *)_stderr);
          goto LAB_00101437;
        }
        __s1 = *argv;
        if (((bVar3) && (*__s1 == '-')) && (__s1[1] != '\0')) break;
        if (pcVar4 == (code *)0x0) {
          __format = "no mode argument provided before filename \'%s\'\n";
          goto LAB_0010146d;
        }
        if ((*__s1 == '-') && (__s1[1] == '\0')) {
          (*pcVar4)("<standard input>",_stdin);
        }
        else {
          __stream = fopen(__s1,"r");
          if (__stream == (FILE *)0x0) {
            __format = "unable to open \'%s\'\n";
            goto LAB_0010146d;
          }
          (*pcVar4)(__s1,__stream);
          fclose(__stream);
        }
        bVar5 = true;
        argc = iVar2 + -1;
      }
      if (__s1[1] != '-') break;
      bVar3 = false;
      argc = iVar2 + -1;
    } while (__s1[2] == '\0');
    iVar1 = strcmp(__s1,"--class");
    argc = iVar2 + -1;
    pcVar4 = class_test;
    if (iVar1 != 0) {
      iVar2 = strcmp(__s1,"--char");
      pcVar4 = char_test;
      if (iVar2 != 0) {
        iVar2 = strcmp(__s1,"--help");
        if (iVar2 == 0) {
          usage(_stdout);
          iVar2 = 0;
        }
        else {
          __format = "unrecognised option \'%s\'\n";
LAB_0010146d:
          fprintf(_stderr,__format,__s1);
LAB_00101437:
          iVar2 = 1;
        }
        return iVar2;
      }
    }
  } while( true );
}

Assistant:

int main(int argc, char **argv)
{
    void (*testfn)(const char *, FILE *) = NULL;
    bool doing_opts = true;
    const char *filename = NULL;
    bool done_something = false;

    ctx = bidi_new_context();

    while (--argc > 0) {
        const char *arg = *++argv;
        if (doing_opts && arg[0] == '-' && arg[1]) {
            if (!strcmp(arg, "--")) {
                doing_opts = false;
            } else if (!strcmp(arg, "--class")) {
                testfn = class_test;
            } else if (!strcmp(arg, "--char")) {
                testfn = char_test;
            } else if (!strcmp(arg, "--help")) {
                usage(stdout);
                return 0;
            } else {
                fprintf(stderr, "unrecognised option '%s'\n", arg);
                return 1;
            }
        } else {
            const char *filename = arg;

            if (!testfn) {
                fprintf(stderr, "no mode argument provided before filename "
                        "'%s'\n", filename);
                return 1;
            }

            if (!strcmp(filename, "-")) {
                testfn("<standard input>", stdin);
            } else {
                FILE *fp = fopen(filename, "r");
                if (!fp) {
                    fprintf(stderr, "unable to open '%s'\n", filename);
                    return 1;
                }
                testfn(filename, fp);
                fclose(fp);
            }
            done_something = true;
        }
    }

    if (!done_something) {
        usage(stderr);
        return 1;
    }

    if (!filename)
        filename = "-";

    printf("pass %d fail %d total %d\n", pass, fail, pass + fail);

    bidi_free_context(ctx);
    return fail != 0;
}